

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

Lazy<void> __thiscall
cinatra::coro_http_server::start_one
          (coro_http_server *this,shared_ptr<cinatra::coro_http_connection> *conn)

{
  bool bVar1;
  undefined8 *puVar2;
  LazyPromise<void> *this_00;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  LazyBase<void,_false> in_RDI;
  coro_http_connection *in_stack_000022d0;
  shared_ptr<cinatra::coro_http_connection> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  LazyPromise<void> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar3;
  
  puVar2 = (undefined8 *)operator_new(0x60,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = start_one;
    puVar2[1] = start_one;
    this_00 = (LazyPromise<void> *)(puVar2 + 2);
    std::shared_ptr<cinatra::coro_http_connection>::shared_ptr
              ((shared_ptr<cinatra::coro_http_connection> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    async_simple::coro::detail::LazyPromise<void>::LazyPromise
              ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    async_simple::coro::detail::LazyPromise<void>::get_return_object(in_stack_fffffffffffffed8);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this_00);
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x59));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x59));
      std::
      __shared_ptr_access<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16734f);
      coro_http_connection::start(in_stack_000022d0);
      async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<void>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (Lazy<void> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                        ((LazyAwaiterBase<void> *)(puVar2 + 9));
      if (bVar1) {
        puVar2[8] = (LazyAwaiterBase<void> *)(puVar2 + 9);
        async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                  ((LazyAwaiterBase<void> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        iVar3 = 0;
        async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x167478);
        async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x167485);
        if (iVar3 == 0) {
          async_simple::coro::detail::LazyPromise<void>::return_void(this_00);
          async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this_00);
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0x5a));
          if (!bVar1) {
            *puVar2 = 0;
            start_one((void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<void>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0x5a));
        }
        async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x1675b9);
        std::shared_ptr<cinatra::coro_http_connection>::~shared_ptr
                  ((shared_ptr<cinatra::coro_http_connection> *)0x1675c3);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0x60);
        }
      }
      else {
        *(undefined1 *)(puVar2 + 0xb) = 1;
        start_one((void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                  in_stack_fffffffffffffed8);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)(puVar2 + 0xb) = 0;
      start_one((void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<void> start_one(
      std::shared_ptr<coro_http_connection> conn) noexcept {
    co_await conn->start();
  }